

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

int coda_type_vsf_integer_set_type(coda_type_special *type,coda_type *base_type)

{
  coda_format cVar1;
  coda_format cVar2;
  int iVar3;
  coda_type_record_field *field;
  char *pcVar4;
  char *pcVar5;
  
  cVar1 = type->format;
  cVar2 = base_type->format;
  if (cVar1 == cVar2) {
    if (type->base_type[1].name == (char *)0x1) {
      field = coda_type_record_field_new("value");
      if (field == (coda_type_record_field *)0x0) {
        return -1;
      }
      if (field->type == (coda_type *)0x0) {
        field->type = base_type;
        base_type->retain_count = base_type->retain_count + 1;
        iVar3 = coda_type_record_add_field((coda_type_record *)type->base_type,field);
        if (iVar3 == 0) {
          type->bit_size = type->base_type->bit_size;
          return 0;
        }
      }
      else {
        coda_set_error(-400,"field already has a type");
      }
      coda_type_record_field_delete(field);
      return -1;
    }
    coda_set_error(-400,"value should be second field of a vsf integer record");
  }
  else {
    pcVar4 = "unknown";
    pcVar5 = "unknown";
    if (cVar2 < (coda_format_rinex|coda_format_xml)) {
      pcVar5 = *(char **)(&DAT_001c0b18 + (ulong)cVar2 * 8);
    }
    if (cVar1 < (coda_format_rinex|coda_format_xml)) {
      pcVar4 = *(char **)(&DAT_001c0b18 + (ulong)cVar1 * 8);
    }
    coda_set_error(-400,"cannot use element type with %s format for vsf integer with %s format",
                   pcVar5,pcVar4);
  }
  return -1;
}

Assistant:

int coda_type_vsf_integer_set_type(coda_type_special *type, coda_type *base_type)
{
    coda_type_record_field *field;

    if (type->format != base_type->format)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION,
                       "cannot use element type with %s format for vsf integer with %s format",
                       coda_type_get_format_name(base_type->format), coda_type_get_format_name(type->format));
        return -1;
    }
    if (((coda_type_record *)type->base_type)->num_fields != 1)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "value should be second field of a vsf integer record");
        return -1;
    }

    field = coda_type_record_field_new("value");
    if (field == NULL)
    {
        return -1;
    }
    if (coda_type_record_field_set_type(field, base_type) != 0)
    {
        coda_type_record_field_delete(field);
        return -1;
    }
    if (coda_type_record_add_field((coda_type_record *)type->base_type, field) != 0)
    {
        coda_type_record_field_delete(field);
        return -1;
    }
    /* update bit_size */
    type->bit_size = type->base_type->bit_size;
    return 0;
}